

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O3

int yaml_check_utf8(yaml_char_t *start,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  yaml_char_t *pointer;
  uint uVar6;
  ulong uVar7;
  
  if ((long)length < 1) {
    return 1;
  }
  pbVar5 = start + length;
  do {
    bVar2 = *start;
    uVar6 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      uVar4 = (uint)bVar2;
      if ((uVar6 & 0xffffffe0) == 0xc0) {
        uVar6 = uVar6 & 0x1f;
        uVar3 = 2;
      }
      else {
        uVar3 = (uint)((uVar4 & 0xfffffff8) == 0xf0) << 2;
        if ((uVar4 & 0xfffffff0) == 0xe0) {
          uVar3 = 3;
          uVar6 = uVar6 & 0xf;
        }
        else {
          uVar6 = uVar4 & 7;
          if ((uVar4 & 0xfffffff8) != 0xf0) {
            uVar6 = 0;
          }
        }
        if (uVar3 == 0) {
          return 0;
        }
      }
      pbVar1 = start + uVar3;
      if (pbVar5 < pbVar1) {
        return 0;
      }
      if (1 < uVar3) {
        uVar7 = 1;
        do {
          if ((start[uVar7] & 0xc0) != 0x80) {
            return 0;
          }
          uVar4 = uVar6 << 6;
          uVar6 = start[uVar7] & 0x3f | uVar4;
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
        if (((uVar3 != 2) || (uVar4 < 0x80)) && ((uVar3 != 3 || (uVar4 < 0x800)))) {
          if (uVar3 != 4) {
            return 0;
          }
          if (uVar4 < 0x10000) {
            return 0;
          }
        }
      }
    }
    else {
      pbVar1 = start + 1;
      if (pbVar5 < start + 1) {
        return 0;
      }
    }
    start = pbVar1;
    if (pbVar5 <= start) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
yaml_check_utf8(yaml_char_t *start, size_t length)
{
    yaml_char_t *end = start+length;
    yaml_char_t *pointer = start;

    while (pointer < end) {
        unsigned char octet;
        unsigned int width;
        unsigned int value;
        size_t k;

        octet = pointer[0];
        width = (octet & 0x80) == 0x00 ? 1 :
                (octet & 0xE0) == 0xC0 ? 2 :
                (octet & 0xF0) == 0xE0 ? 3 :
                (octet & 0xF8) == 0xF0 ? 4 : 0;
        value = (octet & 0x80) == 0x00 ? octet & 0x7F :
                (octet & 0xE0) == 0xC0 ? octet & 0x1F :
                (octet & 0xF0) == 0xE0 ? octet & 0x0F :
                (octet & 0xF8) == 0xF0 ? octet & 0x07 : 0;
        if (!width) return 0;
        if (pointer+width > end) return 0;
        for (k = 1; k < width; k ++) {
            octet = pointer[k];
            if ((octet & 0xC0) != 0x80) return 0;
            value = (value << 6) + (octet & 0x3F);
        }
        if (!((width == 1) ||
            (width == 2 && value >= 0x80) ||
            (width == 3 && value >= 0x800) ||
            (width == 4 && value >= 0x10000))) return 0;

        pointer += width;
    }

    return 1;
}